

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::DebugCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  char *pcVar2;
  Output OStack_18;
  char *params_local;
  
  params_local = params;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    std::operator<<((ostream *)&std::cout,(string *)token::Debug_abi_cxx11_);
    Output::~Output(&OStack_18);
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"Toggle debug mode.");
  }
  else {
    ChessEngine::_debug = ChessEngine::_debug ^ 1;
    Output::Output(&OStack_18,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"debug ");
    pcVar2 = "off";
    if (ChessEngine::_debug != 0) {
      pcVar2 = "on";
    }
    std::operator<<((ostream *)&std::cout,pcVar2);
  }
  Output::~Output(&OStack_18);
  return;
}

Assistant:

void UCIAdapter::DebugCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Debug;
    Output() << "Toggle debug mode.";
    return;
  }

  engine->SetDebug(!engine->IsDebugOn());
  Output() << "debug " << (engine->IsDebugOn() ? "on" : "off");
}